

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closureHoisting.h
# Opt level: O2

void __thiscall
SQCompilation::ClosureHoistingOpt::VarScope::VarScope
          (VarScope *this,Arena *arena,VarScope *p,ScopeKind k)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_ArenaObj)._vptr_ArenaObj = (_func_int **)&PTR__VarScope_0019adc8;
  (this->symbols).
  super_map<const_char_*,_SQCompilation::Decl_*,_SQCompilation::cmp_str,_StdArenaAllocator<std::pair<const_char_*const,_SQCompilation::Decl_*>_>_>
  ._M_t._M_impl.super__Node_allocator._arena = arena;
  (this->symbols).
  super_map<const_char_*,_SQCompilation::Decl_*,_SQCompilation::cmp_str,_StdArenaAllocator<std::pair<const_char_*const,_SQCompilation::Decl_*>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->symbols).
  super_map<const_char_*,_SQCompilation::Decl_*,_SQCompilation::cmp_str,_StdArenaAllocator<std::pair<const_char_*const,_SQCompilation::Decl_*>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->symbols).
            super_map<const_char_*,_SQCompilation::Decl_*,_SQCompilation::cmp_str,_StdArenaAllocator<std::pair<const_char_*const,_SQCompilation::Decl_*>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->symbols).
  super_map<const_char_*,_SQCompilation::Decl_*,_SQCompilation::cmp_str,_StdArenaAllocator<std::pair<const_char_*const,_SQCompilation::Decl_*>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->symbols).
  super_map<const_char_*,_SQCompilation::Decl_*,_SQCompilation::cmp_str,_StdArenaAllocator<std::pair<const_char_*const,_SQCompilation::Decl_*>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->symbols).
  super_map<const_char_*,_SQCompilation::Decl_*,_SQCompilation::cmp_str,_StdArenaAllocator<std::pair<const_char_*const,_SQCompilation::Decl_*>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->candidates).
  super_map<SQCompilation::FunctionDecl_*,_int,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_int>_>_>
  ._M_t._M_impl.super__Node_allocator._arena = arena;
  p_Var1 = &(this->candidates).
            super_map<SQCompilation::FunctionDecl_*,_int,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_int>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->candidates).
  super_map<SQCompilation::FunctionDecl_*,_int,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->candidates).
  super_map<SQCompilation::FunctionDecl_*,_int,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->candidates).
  super_map<SQCompilation::FunctionDecl_*,_int,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->candidates).
  super_map<SQCompilation::FunctionDecl_*,_int,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->candidates).
  super_map<SQCompilation::FunctionDecl_*,_int,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->parent = p;
  this->kind = k;
  return;
}

Assistant:

VarScope(Arena *arena, VarScope *p, enum ScopeKind k) : symbols(SymbolsMap::Allocator(arena)), parent(p), candidates(CandidateMap::Allocator(arena)), kind(k) {}